

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Strftime(jx9_context *pCtx,char *zIn,int nLen,Sytm *pTm)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  ulong local_48;
  time_t tt;
  char *pcStack_38;
  int c;
  char *zEnd;
  char *zCur;
  Sytm *pTm_local;
  char *pcStack_18;
  int nLen_local;
  char *zIn_local;
  jx9_context *pCtx_local;
  
  pcStack_38 = zIn + nLen;
  zCur = (char *)pTm;
  pTm_local._4_4_ = nLen;
  pcStack_18 = zIn;
  zIn_local = (char *)pCtx;
  while( true ) {
    pcVar2 = pcStack_18;
    zEnd = pcStack_18;
    while( true ) {
      bVar3 = false;
      if (pcStack_18 < pcStack_38) {
        bVar3 = *pcStack_18 != '%';
      }
      if (!bVar3) break;
      pcStack_18 = pcStack_18 + 1;
    }
    if (pcVar2 < pcStack_18) {
      jx9_result_string((jx9_context *)zIn_local,pcVar2,(int)pcStack_18 - (int)pcVar2);
    }
    pcVar2 = zIn_local;
    pcStack_18 = pcStack_18 + 1;
    if (pcStack_38 <= pcStack_18) break;
    tt._4_4_ = (int)*pcStack_18;
    switch(tt._4_4_) {
    case 0x25:
      jx9_result_string((jx9_context *)zIn_local,"%",1);
      break;
    default:
      break;
    case 0x41:
      pcVar1 = SyTimeGetDay(*(sxi32 *)(zCur + 0x18));
      jx9_result_string((jx9_context *)pcVar2,pcVar1,-1);
      break;
    case 0x42:
      pcVar1 = SyTimeGetMonth(*(sxi32 *)(zCur + 0x10));
      jx9_result_string((jx9_context *)pcVar2,pcVar1,-1);
      break;
    case 0x43:
      jx9_result_string_format
                ((jx9_context *)zIn_local,"%2d",(long)*(int *)(zCur + 0x14) / 100 & 0xffffffff);
      break;
    case 0x44:
    case 0x78:
      jx9_result_string_format
                ((jx9_context *)zIn_local,"%02d/%02d/%02d",(ulong)(*(int *)(zCur + 0x10) + 1),
                 (ulong)*(uint *)(zCur + 0xc),(long)*(int *)(zCur + 0x14) % 100 & 0xffffffff);
      break;
    case 0x46:
      jx9_result_string_format
                ((jx9_context *)zIn_local,"%d-%02d-%02d",(ulong)*(uint *)(zCur + 0x14),
                 (ulong)(*(int *)(zCur + 0x10) + 1),(ulong)*(uint *)(zCur + 0xc));
      break;
    case 0x47:
    case 0x59:
      jx9_result_string_format((jx9_context *)zIn_local,"%4d",(ulong)*(uint *)(zCur + 0x14));
      break;
    case 0x48:
      jx9_result_string_format((jx9_context *)zIn_local,"%02d",(ulong)*(uint *)(zCur + 8));
      break;
    case 0x49:
      jx9_result_string_format
                ((jx9_context *)zIn_local,"%02d",(ulong)(*(int *)(zCur + 8) % 0xc + 1));
      break;
    case 0x4d:
      jx9_result_string_format((jx9_context *)zIn_local,"%02d",(ulong)*(uint *)(zCur + 4));
      break;
    case 0x50:
      pcVar2 = "am";
      if (0xc < *(int *)(zCur + 8)) {
        pcVar2 = "pm";
      }
      jx9_result_string((jx9_context *)zIn_local,pcVar2,2);
      break;
    case 0x52:
      jx9_result_string_format
                ((jx9_context *)zIn_local,"%02d:%02d",(ulong)*(uint *)(zCur + 8),
                 (ulong)*(uint *)(zCur + 4));
      break;
    case 0x53:
      jx9_result_string_format((jx9_context *)zIn_local,"%02d",(ulong)*(uint *)zCur);
      break;
    case 0x54:
    case 0x58:
      jx9_result_string_format
                ((jx9_context *)zIn_local,"%02d:%02d:%02d",(ulong)*(uint *)(zCur + 8),
                 (ulong)*(uint *)(zCur + 4),(ulong)*(uint *)zCur);
      break;
    case 0x5a:
    case 0x7a:
      zEnd = *(char **)(zCur + 0x28);
      if (zEnd == (char *)0x0) {
        zEnd = "GMT";
      }
      jx9_result_string((jx9_context *)zIn_local,zEnd,-1);
      break;
    case 0x61:
      pcVar1 = SyTimeGetDay(*(sxi32 *)(zCur + 0x18));
      jx9_result_string((jx9_context *)pcVar2,pcVar1,3);
      break;
    case 0x62:
    case 0x68:
      pcVar1 = SyTimeGetMonth(*(sxi32 *)(zCur + 0x10));
      jx9_result_string((jx9_context *)pcVar2,pcVar1,3);
      break;
    case 99:
      jx9_result_string_format
                ((jx9_context *)zIn_local,"%d-%02d-%02d %02d:%02d:%02d",
                 (ulong)*(uint *)(zCur + 0x14),(ulong)(*(int *)(zCur + 0x10) + 1),
                 (ulong)*(uint *)(zCur + 0xc),(ulong)*(uint *)(zCur + 8),*(undefined4 *)(zCur + 4),
                 *(undefined4 *)zCur);
      break;
    case 100:
      jx9_result_string_format((jx9_context *)zIn_local,"%02d",(ulong)(*(int *)(zCur + 0x10) + 1));
      break;
    case 0x65:
      jx9_result_string_format((jx9_context *)zIn_local,"%2d",(ulong)*(uint *)(zCur + 0xc));
      break;
    case 0x67:
    case 0x79:
      jx9_result_string_format
                ((jx9_context *)zIn_local,"%2d",(long)*(int *)(zCur + 0x14) % 100 & 0xffffffff);
      break;
    case 0x6a:
      jx9_result_string_format((jx9_context *)zIn_local,"%03d",(ulong)*(uint *)(zCur + 0x1c));
      break;
    case 0x6c:
      jx9_result_string_format((jx9_context *)zIn_local,"%2d",(ulong)(*(int *)(zCur + 8) % 0xc + 1))
      ;
      break;
    case 0x6d:
      jx9_result_string_format((jx9_context *)zIn_local,"%02d",(ulong)(*(int *)(zCur + 0x10) + 1));
      break;
    case 0x6e:
      jx9_result_string((jx9_context *)zIn_local,"\n",1);
      break;
    case 0x70:
      pcVar2 = "AM";
      if (0xc < *(int *)(zCur + 8)) {
        pcVar2 = "PM";
      }
      jx9_result_string((jx9_context *)zIn_local,pcVar2,2);
      break;
    case 0x72:
      pcVar2 = "AM";
      if (0xc < *(int *)(zCur + 8)) {
        pcVar2 = "PM";
      }
      jx9_result_string_format
                ((jx9_context *)zIn_local,"%02d:%02d:%02d %s",(ulong)(*(int *)(zCur + 8) % 0xc + 1),
                 (ulong)*(uint *)(zCur + 4),(ulong)*(uint *)zCur,pcVar2);
      break;
    case 0x73:
      time((time_t *)&local_48);
      jx9_result_string_format((jx9_context *)zIn_local,"%u",local_48 & 0xffffffff);
      break;
    case 0x74:
      jx9_result_string((jx9_context *)zIn_local,"\t",1);
      break;
    case 0x75:
      jx9_result_string_format
                ((jx9_context *)zIn_local,"%d",(ulong)(uint)aISO8601[*(int *)(zCur + 0x18) % 7]);
      break;
    case 0x77:
      jx9_result_string_format((jx9_context *)zIn_local,"%d",(ulong)*(uint *)(zCur + 0x18));
    }
    pcStack_18 = pcStack_18 + 1;
  }
  return 0;
}

Assistant:

static int jx9Strftime(
	jx9_context *pCtx,  /* Call context */
	const char *zIn,    /* Input string */
	int nLen,           /* Input length */
	Sytm *pTm           /* Parse of the given time */
	)
{
	const char *zCur, *zEnd = &zIn[nLen];
	int c;
	/* Start the format process */
	for(;;){
		zCur = zIn;
		while(zIn < zEnd && zIn[0] != '%' ){
			zIn++;
		}
		if( zIn > zCur ){
			/* Consume input verbatim */
			jx9_result_string(pCtx, zCur, (int)(zIn-zCur));
		}
		zIn++; /* Jump the percent sign */
		if( zIn >= zEnd ){
			/* No more input to process */
			break;
		}
		c = zIn[0];
		/* Act according to the current specifer */
		switch(c){
		case '%':
			/* A literal percentage character ("%") */
			jx9_result_string(pCtx, "%", (int)sizeof(char));
			break;
		case 't':
			/* A Tab character */
			jx9_result_string(pCtx, "\t", (int)sizeof(char));
			break;
		case 'n':
			/* A newline character */
			jx9_result_string(pCtx, "\n", (int)sizeof(char));
			break;
		case 'a':
			/* An abbreviated textual representation of the day */
			jx9_result_string(pCtx, SyTimeGetDay(pTm->tm_wday), (int)sizeof(char)*3);
			break;
		case 'A':
			/* A full textual representation of the day */
			jx9_result_string(pCtx, SyTimeGetDay(pTm->tm_wday), -1/*Compute length automatically*/);
			break;
		case 'e':
			/* Day of the month, 2 digits with leading space for single digit*/
			jx9_result_string_format(pCtx, "%2d", pTm->tm_mday);
			break;
		case 'd':
			/* Two-digit day of the month (with leading zeros) */
			jx9_result_string_format(pCtx, "%02d", pTm->tm_mon+1);
			break;
		case 'j':
			/*The day of the year, 3 digits with leading zeros*/
			jx9_result_string_format(pCtx, "%03d", pTm->tm_yday);
			break;
		case 'u':
			/* ISO-8601 numeric representation of the day of the week */
			jx9_result_string_format(pCtx, "%d", aISO8601[pTm->tm_wday % 7 ]);
			break;
		case 'w':
			/* Numeric representation of the day of the week */
			jx9_result_string_format(pCtx, "%d", pTm->tm_wday);
			break;
		case 'b':
		case 'h':
			/*A short textual representation of a month, three letters (Not based on locale)*/
			jx9_result_string(pCtx, SyTimeGetMonth(pTm->tm_mon), (int)sizeof(char)*3);
			break;
		case 'B':
			/* Full month name (Not based on locale) */
			jx9_result_string(pCtx, SyTimeGetMonth(pTm->tm_mon), -1/*Compute length automatically*/);
			break;
		case 'm':
			/*Numeric representation of a month, with leading zeros*/
			jx9_result_string_format(pCtx, "%02d", pTm->tm_mon + 1);
			break;
		case 'C':
			/* Two digit representation of the century */
			jx9_result_string_format(pCtx, "%2d", pTm->tm_year/100);
			break;
		case 'y':
		case 'g':
			/* Two digit representation of the year */
			jx9_result_string_format(pCtx, "%2d", pTm->tm_year%100);
			break;
		case 'Y':
		case 'G':
			/* Four digit representation of the year */
			jx9_result_string_format(pCtx, "%4d", pTm->tm_year);
			break;
		case 'I':
			/* 12-hour format of an hour with leading zeros */
			jx9_result_string_format(pCtx, "%02d", 1+(pTm->tm_hour%12));
			break;
		case 'l':
			/* 12-hour format of an hour with leading space */
			jx9_result_string_format(pCtx, "%2d", 1+(pTm->tm_hour%12));
			break;
		case 'H':
			/* 24-hour format of an hour with leading zeros */
			jx9_result_string_format(pCtx, "%02d", pTm->tm_hour);
			break;
		case 'M':
			/* Minutes with leading zeros */
			jx9_result_string_format(pCtx, "%02d", pTm->tm_min);
			break;
		case 'S':
			/* Seconds with leading zeros */
			jx9_result_string_format(pCtx, "%02d", pTm->tm_sec);
			break;
		case 'z':
		case 'Z':
			/* 	Timezone identifier */
			zCur = pTm->tm_zone;
			if( zCur == 0 ){
				/* Assume GMT */
				zCur = "GMT";
			}
			jx9_result_string(pCtx, zCur, -1);
			break;
		case 'T':
		case 'X':
			/* Same as "%H:%M:%S" */
			jx9_result_string_format(pCtx, "%02d:%02d:%02d", pTm->tm_hour, pTm->tm_min, pTm->tm_sec);
			break;
		case 'R':
			/* Same as "%H:%M" */
			jx9_result_string_format(pCtx, "%02d:%02d", pTm->tm_hour, pTm->tm_min);
			break;
		case 'P':
			/*	Lowercase Ante meridiem and Post meridiem */
			jx9_result_string(pCtx, pTm->tm_hour > 12 ? "pm" : "am", (int)sizeof(char)*2);
			break;
		case 'p':
			/*	Uppercase Ante meridiem and Post meridiem */
			jx9_result_string(pCtx, pTm->tm_hour > 12 ? "PM" : "AM", (int)sizeof(char)*2);
			break;
		case 'r':
			/* Same as "%I:%M:%S %p" */
			jx9_result_string_format(pCtx, "%02d:%02d:%02d %s", 
				1+(pTm->tm_hour%12), 
				pTm->tm_min, 
				pTm->tm_sec, 
				pTm->tm_hour > 12 ? "PM" : "AM"
				);
			break;
		case 'D':
		case 'x':
			/* Same as "%m/%d/%y" */
			jx9_result_string_format(pCtx, "%02d/%02d/%02d", 
				pTm->tm_mon+1, 
				pTm->tm_mday, 
				pTm->tm_year%100
				);
			break;
		case 'F':
			/* Same as "%Y-%m-%d" */
			jx9_result_string_format(pCtx, "%d-%02d-%02d", 
				pTm->tm_year, 
				pTm->tm_mon+1, 
				pTm->tm_mday
				);
			break;
		case 'c':
			jx9_result_string_format(pCtx, "%d-%02d-%02d %02d:%02d:%02d", 
				pTm->tm_year, 
				pTm->tm_mon+1, 
				pTm->tm_mday, 
				pTm->tm_hour, 
				pTm->tm_min, 
				pTm->tm_sec
				);
			break;
		case 's':{
			time_t tt;
			/* Seconds since the Unix Epoch */
			time(&tt);
			jx9_result_string_format(pCtx, "%u", (unsigned int)tt);
			break;
				 }
		default:
			/* unknown specifer, simply ignore*/
			break;
		}
		/* Advance the cursor */
		zIn++;
	}
	return SXRET_OK;
}